

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O0

int encoder_append_uint32_value(ndn_encoder_t *encoder,uint32_t value)

{
  int local_20;
  int i;
  uint32_t value_local;
  ndn_encoder_t *encoder_local;
  
  if (encoder->output_max_size < encoder->offset + 4) {
    encoder_local._4_4_ = -10;
  }
  else {
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      encoder->output_value[encoder->offset + local_20] =
           (uint8_t)(value >> (('\x03' - (char)local_20) * '\b' & 0x1fU));
    }
    encoder->offset = encoder->offset + 4;
    encoder_local._4_4_ = 0;
  }
  return encoder_local._4_4_;
}

Assistant:

static inline int
encoder_append_uint32_value(ndn_encoder_t* encoder, uint32_t value)
{
  if (encoder->offset + 4 > encoder->output_max_size)
    return NDN_OVERSIZE;
  for (int i = 0; i < 4; i++) {
    encoder->output_value[encoder->offset + i] = (value >> (8 * (3 - i))) & 0xFF;
  }
  encoder->offset += 4;
  return 0;
}